

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O2

const_iterator __thiscall ser::MetainfoSet::checkKeyExists(MetainfoSet *this,string *key)

{
  const_iterator cVar1;
  ostream *poVar2;
  SerializationException *this_00;
  string local_1d0 [32];
  SerializationException exception;
  ostringstream ss;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  *)this,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
    return (const_iterator)cVar1._M_node;
  }
  exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
  exception._0_8_ = &PTR__SerializationException_00138910;
  exception.message_._M_string_length = 0;
  exception.message_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar2 = std::operator<<((ostream *)&ss,"Error: Requested key ");
  poVar2 = std::operator<<(poVar2,(string *)key);
  std::operator<<(poVar2," is not in set\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&exception.message_);
  std::__cxx11::string::~string(local_1d0);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,&exception);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

std::map<std::string, boost::any>::const_iterator MetainfoSet::checkKeyExists(const std::string& key) const
{
    std::map<std::string, boost::any>::const_iterator iter = data_.find(key);
    if (iter == data_.end())
    {
        SerializationException exception;
        std::ostringstream ss;
        ss << "Error: Requested key " << key << " is not in set\n";
        exception.Init(ss.str());
        throw exception;
    }
    return iter;
}